

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

void foldrule(char *p)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t local_24;
  uint32_t i;
  uint32_t key;
  uint32_t right;
  uint32_t left;
  uint32_t op;
  char *p_local;
  
  _left = p;
  uVar1 = nexttoken((char **)&left,0,0);
  uVar2 = nexttoken((char **)&left,0,0x7f);
  uVar3 = nexttoken((char **)&left,1,0x3ff);
  uVar4 = funcidx << 0x18 | uVar1 << 0x11 | uVar2 << 10 | uVar3;
  if (0xfff < nkeys) {
    fprintf(_stderr,"Error: too many fold rules, increase BUILD_MAX_FOLD.\n");
    exit(1);
  }
  local_24 = nkeys;
  while ((local_24 != 0 && ((uVar4 & 0xffffff) <= (foldkeys[local_24 - 1] & 0xffffff)))) {
    if ((foldkeys[local_24 - 1] & 0xffffff) == (uVar4 & 0xffffff)) {
      fprintf(_stderr,"Error: duplicate fold definition at line %d\n",(ulong)(uint)lineno);
      exit(1);
    }
    foldkeys[local_24] = foldkeys[local_24 - 1];
    local_24 = local_24 - 1;
  }
  foldkeys[local_24] = uVar4;
  nkeys = nkeys + 1;
  return;
}

Assistant:

static void foldrule(char *p)
{
  uint32_t op = nexttoken(&p, 0, 0);
  uint32_t left = nexttoken(&p, 0, 0x7f);
  uint32_t right = nexttoken(&p, 1, 0x3ff);
  uint32_t key = (funcidx << 24) | (op << 17) | (left << 10) | right;
  uint32_t i;
  if (nkeys >= BUILD_MAX_FOLD) {
    fprintf(stderr, "Error: too many fold rules, increase BUILD_MAX_FOLD.\n");
    exit(1);
  }
  /* Simple insertion sort to detect duplicates. */
  for (i = nkeys; i > 0; i--) {
    if ((foldkeys[i-1]&0xffffff) < (key & 0xffffff))
      break;
    if ((foldkeys[i-1]&0xffffff) == (key & 0xffffff)) {
      fprintf(stderr, "Error: duplicate fold definition at line %d\n", lineno);
      exit(1);
    }
    foldkeys[i] = foldkeys[i-1];
  }
  foldkeys[i] = key;
  nkeys++;
}